

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O0

KeyCode anon_unknown.dwarf_297138::keyToKeyCode(Key key)

{
  KeyCode KVar1;
  Display *display_00;
  Display *pDVar2;
  Key in_EDI;
  KeyCode keycode;
  Display *display;
  KeySym keysym;
  KeyCode local_1;
  
  display_00 = (Display *)sf::priv::keyToKeySym(in_EDI);
  if (display_00 != (Display *)0x0) {
    pDVar2 = sf::priv::OpenDisplay();
    KVar1 = XKeysymToKeycode(pDVar2,display_00);
    sf::priv::CloseDisplay(display_00);
    if (KVar1 != '\0') {
      return KVar1;
    }
  }
  if (in_EDI == RAlt) {
    local_1 = (anonymous_namespace)::scancodeToKeycode[0x85];
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

KeyCode keyToKeyCode(sf::Keyboard::Key key)
{
    KeySym keysym = sf::priv::keyToKeySym(key);

    if (keysym != NoSymbol)
    {
        Display* display = sf::priv::OpenDisplay();
        KeyCode keycode = XKeysymToKeycode(display, keysym);
        sf::priv::CloseDisplay(display);

        if (keycode != NullKeyCode)
            return keycode;
    }

    // Fallback for when XKeysymToKeycode cannot tell the KeyCode for XK_Alt_R
    if (key == sf::Keyboard::RAlt)
        return scancodeToKeycode[sf::Keyboard::Scan::RAlt];

    return NullKeyCode;
}